

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getEdgesForRCF(RDL_data *data,uint index,RDL_edge **ptr)

{
  uint **ppuVar1;
  void *__ptr;
  uint *__ptr_00;
  RDL_edge *paRVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (index < data->nofRCFs) {
      __ptr = malloc(0x200);
      __ptr_00 = RDL_getEdgesRCF(data,index);
      if (*__ptr_00 == 0xffffffff) {
        uVar5 = 0;
      }
      else {
        uVar3 = 0x40;
        uVar5 = 0;
        puVar6 = __ptr_00;
        do {
          if ((int)uVar5 == (int)uVar3) {
            uVar3 = (ulong)(uint)((int)uVar3 * 2);
            __ptr = realloc(__ptr,uVar3 * 8);
          }
          ppuVar1 = data->graph->edges;
          *(uint *)((long)__ptr + uVar5 * 8) = *ppuVar1[*puVar6];
          *(uint *)((long)__ptr + uVar5 * 8 + 4) = ppuVar1[*puVar6][1];
          uVar5 = (ulong)((int)uVar5 + 1);
          puVar6 = __ptr_00 + uVar5;
        } while (__ptr_00[uVar5] != 0xffffffff);
      }
      uVar4 = (uint)uVar5;
      paRVar2 = (RDL_edge *)realloc(__ptr,uVar5 << 3);
      free(__ptr_00);
      goto LAB_00105d98;
    }
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n",index);
  }
  paRVar2 = (RDL_edge *)malloc(8);
  uVar4 = 0xffffffff;
LAB_00105d98:
  *ptr = paRVar2;
  return uVar4;
}

Assistant:

unsigned RDL_getEdgesForRCF(const RDL_data *data, unsigned index, RDL_edge **ptr)
{
  unsigned nextfree, alloced;
  RDL_edge *result;
  unsigned *edgeIndices;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (index >= data->nofRCFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  nextfree = 0;
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));
  edgeIndices = RDL_getEdgesRCF(data, index);
  /* translate result from edge indices to edges */
  for(i=0; edgeIndices[i]<UINT_MAX; ++i)
  {
    if(nextfree == alloced)/*more space needed in result*/
    {
      alloced *= 2; /* double the space */
      result = realloc(result, alloced * sizeof(*result));
    }
    result[nextfree][0] = data->graph->edges[edgeIndices[i]][0];
    result[nextfree][1] = data->graph->edges[edgeIndices[i]][1];
    ++nextfree;
  }
  result = realloc(result, nextfree * sizeof(*result));
  free(edgeIndices);
  (*ptr) = result;
  return nextfree;
}